

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  search_null();
  search_boolean();
  search_integer();
  search_real();
  search_string();
  search_wstring();
  search_u16string();
  search_u32string();
  search_array();
  search_map();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    search_null();
    search_boolean();
    search_integer();
    search_real();
    search_string();
    search_wstring();
    search_u16string();
    search_u32string();
    search_array();
    search_map();

    return boost::report_errors();
}